

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameColumnIdlistNames(Parse *pParse,RenameCtx *pCtx,IdList *pIdList,char *zOld)

{
  char *zLeft;
  int iVar1;
  IdList_item *pIVar2;
  int i;
  long lVar3;
  
  if (pIdList != (IdList *)0x0) {
    pIVar2 = pIdList->a;
    for (lVar3 = 0; lVar3 < pIdList->nId; lVar3 = lVar3 + 1) {
      zLeft = pIVar2->zName;
      iVar1 = sqlite3_stricmp(zLeft,zOld);
      if (iVar1 == 0) {
        renameTokenFind(pParse,pCtx,zLeft);
      }
      pIVar2 = pIVar2 + 1;
    }
  }
  return;
}

Assistant:

static void renameColumnIdlistNames(
  Parse *pParse,
  RenameCtx *pCtx,
  const IdList *pIdList,
  const char *zOld
){
  if( pIdList ){
    int i;
    for(i=0; i<pIdList->nId; i++){
      const char *zName = pIdList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (const void*)zName);
      }
    }
  }
}